

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfilesystementry.cpp
# Opt level: O0

QString * __thiscall QFileSystemEntry::completeBaseName(QFileSystemEntry *this)

{
  QString *in_RDI;
  qsizetype in_stack_00000008;
  qsizetype in_stack_00000010;
  QString *in_stack_00000018;
  int length;
  undefined4 in_stack_ffffffffffffffe8;
  undefined4 in_stack_ffffffffffffffec;
  
  findFileNameSeparators
            ((QFileSystemEntry *)CONCAT44(in_stack_ffffffffffffffec,in_stack_ffffffffffffffe8));
  QString::mid(in_stack_00000018,in_stack_00000010,in_stack_00000008);
  return in_RDI;
}

Assistant:

QString QFileSystemEntry::completeBaseName() const
{
    findFileNameSeparators();
    int length = -1;
    if (m_firstDotInFileName >= 0) {
        length = m_firstDotInFileName + m_lastDotInFileName;
        if (m_lastSeparator != -1) // avoid off by one
            length--;
    }
#if defined(Q_OS_WIN)
    if (m_lastSeparator == -1 && m_filePath.length() >= 2 && m_filePath.at(1) == u':')
        return m_filePath.mid(2, length - 2);
#endif
    return m_filePath.mid(m_lastSeparator + 1, length);
}